

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflatePrime(zng_stream *strm,int32_t bits,int32_t value)

{
  internal_state *piVar1;
  int iVar2;
  uint in_EDX;
  int in_ESI;
  zng_stream *in_RDI;
  inflate_state *state;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    if (in_ESI == 0) {
      local_4 = 0;
    }
    else {
      piVar1 = in_RDI->state;
      if (in_ESI < 0) {
        piVar1->prev = (Pos *)0x0;
        *(undefined4 *)&piVar1->head = 0;
        local_4 = 0;
      }
      else if ((in_ESI < 0x11) && ((uint)(*(int *)&piVar1->head + in_ESI) < 0x21)) {
        piVar1->prev = (Pos *)(((long)(int)(in_EDX & (int)(1L << ((byte)in_ESI & 0x3f)) - 1U) <<
                               ((byte)*(undefined4 *)&piVar1->head & 0x3f)) + (long)piVar1->prev);
        *(int *)&piVar1->head = in_ESI + *(int *)&piVar1->head;
        local_4 = 0;
      }
      else {
        local_4 = -2;
      }
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflatePrime)(PREFIX3(stream) *strm, int32_t bits, int32_t value) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    if (bits == 0)
        return Z_OK;
    INFLATE_PRIME_HOOK(strm, bits, value);  /* hook for IBM Z DFLTCC */
    state = (struct inflate_state *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + (unsigned int)bits > 32)
        return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += (uint64_t)value << state->bits;
    state->bits += (unsigned int)bits;
    return Z_OK;
}